

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O0

int s2pred::TriageCompareEdgeDistance<double>
              (Vector3<double> *x,Vector3<double> *a0,Vector3<double> *a1,double r2)

{
  __type_conflict _Var1;
  double dVar2;
  FloatType FVar3;
  double dVar4;
  int *piVar5;
  int local_134;
  int local_118;
  int local_114 [2];
  int local_10c;
  int line_sign;
  int local_104;
  double dStack_100;
  int vertex_sign;
  double a1_sign_error;
  double a0_sign_error;
  double n1_error;
  double n1;
  double n2;
  double a1_sign;
  double a0_sign;
  Vector3<double> a1_dir;
  Vector3<double> a0_dir;
  Vector3<double> m;
  D local_68;
  undefined1 local_50 [8];
  Vector3<double> n;
  double T_ERR;
  double r2_local;
  Vector3<double> *a1_local;
  Vector3<double> *a0_local;
  Vector3<double> *x_local;
  
  n.c_[2] = 1.1102230246251565e-16;
  util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator-
            (&local_68,(BasicVector<Vector3,_double,_3UL> *)a0,a1);
  util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator+
            ((D *)(m.c_ + 2),(BasicVector<Vector3,_double,_3UL> *)a0,a1);
  Vector3<double>::CrossProd((Vector3<double> *)local_50,&local_68,(Vector3<double> *)(m.c_ + 2));
  Vector3<double>::CrossProd((Vector3<double> *)(a0_dir.c_ + 2),(Vector3<double> *)local_50,x);
  util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator-
            ((D *)(a1_dir.c_ + 2),(BasicVector<Vector3,_double,_3UL> *)a0,x);
  util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator-
            ((D *)&a0_sign,(BasicVector<Vector3,_double,_3UL> *)a1,x);
  a1_sign = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::DotProd
                      ((BasicVector<Vector3,_double,_3UL> *)(a1_dir.c_ + 2),(D *)(a0_dir.c_ + 2));
  n2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::DotProd
                 ((BasicVector<Vector3,_double,_3UL> *)&a0_sign,(D *)(a0_dir.c_ + 2));
  n1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm2
                 ((BasicVector<Vector3,_double,_3UL> *)local_50);
  n1_error = sqrt(n1);
  _Var1 = std::sqrt<int>(3);
  dVar2 = (8.0 / _Var1 + 3.5) * n1_error;
  _Var1 = std::sqrt<int>(3);
  dVar2 = (dVar2 + _Var1 * 32.0 * 1.1102230246251565e-16) * 1.1102230246251565e-16;
  a0_sign_error = dVar2;
  FVar3 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm
                    ((BasicVector<Vector3,_double,_3UL> *)(a1_dir.c_ + 2));
  dVar4 = a0_sign_error;
  a1_sign_error = dVar2 * FVar3;
  FVar3 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm
                    ((BasicVector<Vector3,_double,_3UL> *)&a0_sign);
  dStack_100 = dVar4 * FVar3;
  if ((ABS(a1_sign) < a1_sign_error) || (ABS(n2) < dStack_100)) {
    line_sign = TriageCompareDistance<double>(x,a0,r2);
    local_10c = TriageCompareDistance<double>(x,a1,r2);
    piVar5 = std::min<int>(&line_sign,&local_10c);
    local_104 = *piVar5;
    local_134 = TriageCompareLineDistance<double>
                          (x,a0,a1,r2,(Vector3<double> *)local_50,n1_error,n1);
    if (local_104 != local_134) {
      local_134 = 0;
    }
    x_local._4_4_ = local_134;
  }
  else if ((0.0 <= a1_sign) || (n2 <= 0.0)) {
    local_114[0] = TriageCompareDistance<double>(x,a0,r2);
    local_118 = TriageCompareDistance<double>(x,a1,r2);
    piVar5 = std::min<int>(local_114,&local_118);
    x_local._4_4_ = *piVar5;
  }
  else {
    x_local._4_4_ =
         TriageCompareLineDistance<double>(x,a0,a1,r2,(Vector3<double> *)local_50,n1_error,n1);
  }
  return x_local._4_4_;
}

Assistant:

int TriageCompareEdgeDistance(const Vector3<T>& x, const Vector3<T>& a0,
                              const Vector3<T>& a1, T r2) {
  constexpr T T_ERR = rounding_epsilon<T>();

  // First we need to decide whether the closest point is an edge endpoint or
  // somewhere in the interior.  To determine this we compute a plane
  // perpendicular to (a0, a1) that passes through X.  Letting M be the normal
  // to this plane, the closest point is in the edge interior if and only if
  // a0.M < 0 and a1.M > 0.  Note that we can use "<" rather than "<=" because
  // if a0.M or a1.M is zero exactly then it doesn't matter which code path we
  // follow (since the distance to an endpoint and the distance to the edge
  // interior are exactly the same in this case).
  Vector3<T> n = (a0 - a1).CrossProd(a0 + a1);
  Vector3<T> m = n.CrossProd(x);
  // For better accuracy when the edge (a0,a1) is very short, we subtract "x"
  // before computing the dot products with M.
  Vector3<T> a0_dir = a0 - x;
  Vector3<T> a1_dir = a1 - x;
  T a0_sign = a0_dir.DotProd(m);
  T a1_sign = a1_dir.DotProd(m);
  T n2 = n.Norm2();
  T n1 = sqrt(n2);
  T n1_error = ((3.5 + 8 / sqrt(3)) * n1 + 32 * sqrt(3) * DBL_ERR) * T_ERR;
  T a0_sign_error = n1_error * a0_dir.Norm();
  T a1_sign_error = n1_error * a1_dir.Norm();
  if (fabs(a0_sign) < a0_sign_error || fabs(a1_sign) < a1_sign_error) {
    // It is uncertain whether minimum distance is to an edge vertex or to the
    // edge interior.  We handle this by computing both distances and checking
    // whether they yield the same result.
    int vertex_sign = min(TriageCompareDistance(x, a0, r2),
                          TriageCompareDistance(x, a1, r2));
    int line_sign = TriageCompareLineDistance(x, a0, a1, r2, n, n1, n2);
    return (vertex_sign == line_sign) ? line_sign : 0;
  }
  if (a0_sign >= 0 || a1_sign <= 0) {
    // The minimum distance is to an edge endpoint.
    return min(TriageCompareDistance(x, a0, r2),
               TriageCompareDistance(x, a1, r2));
  } else {
    // The minimum distance is to the edge interior.
    return TriageCompareLineDistance(x, a0, a1, r2, n, n1, n2);
  }
}